

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O1

void compute_hflags(CPUMIPSState_conflict5 *env)

{
  byte *pbVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar4 = env->hflags & 0xc8a7fd04;
  env->hflags = uVar4;
  uVar3 = env->CP0_Status;
  if ((uVar3 & 4) != 0) {
    env->hflags = uVar4 | 0x10000000;
  }
  if (((uVar3 & 6) == 0) && ((env->hflags & 4) == 0)) {
    env->hflags = env->hflags | uVar3 >> 3 & 3;
  }
  uVar2 = env->insn_flags;
  if ((uVar2 & 4) == 0) {
LAB_0098c961:
    uVar4 = env->hflags;
LAB_0098c967:
    env->hflags = uVar4 | 0x200;
  }
  else {
    if ((uVar3 & 0x800020) != 0 || (env->hflags & 3) != 2) {
      env->hflags = env->hflags | 8;
    }
    if ((uVar2 & 4) == 0) goto LAB_0098c961;
    uVar4 = env->hflags;
    uVar5 = uVar4 & 3;
    if (((uVar3 & 0x20) == 0 && uVar5 == 2) ||
       ((((uint)uVar2 >> 0xe & 1) != 0 &&
        (((uVar3 & 0x40) == 0 && uVar5 == 1 || (uVar5 == 0 && (uVar3 & 0x80) == 0))))))
    goto LAB_0098c967;
  }
  if ((((byte)(uVar3 >> 0x1c) & ((uint)uVar2 >> 0xd & 1) == 0) != 0) || ((env->hflags & 3) == 0)) {
    *(byte *)&env->hflags = (byte)env->hflags | 0x10;
  }
  if ((uVar3 >> 0x1d & 1) != 0) {
    *(byte *)&env->hflags = (byte)env->hflags | 0x20;
  }
  if ((uVar3 >> 0x1a & 1) != 0) {
    *(byte *)&env->hflags = (byte)env->hflags | 0x40;
  }
  if (((env->hflags & 3) != 0) && ((env->CP0_Config5 & 0x40) != 0)) {
    env->hflags = env->hflags | 0x400000;
  }
  if ((uVar2 >> 0x25 & 1) == 0) {
    if ((uVar2 >> 0x24 & 1) != 0) {
      uVar4 = 0x180000;
      goto LAB_0098ca60;
    }
    uVar4 = 0x80000;
    if ((uVar3 >> 0x18 & 1) != 0 && (uVar2 >> 0x23 & 1) != 0) goto LAB_0098ca66;
  }
  else {
    uVar4 = 0x20180000;
LAB_0098ca60:
    if ((uVar3 >> 0x18 & 1) != 0) {
LAB_0098ca66:
      env->hflags = env->hflags | uVar4;
    }
  }
  if ((uVar2 & 0x40) == 0) {
    if ((uVar2 & 0x20) == 0) {
      if (-1 < (int)uVar3 || (uVar2 & 8) == 0) goto LAB_0098caad;
      goto LAB_0098ca90;
    }
    uVar3 = env->hflags;
    if ((uVar3 & 8) == 0) goto LAB_0098caad;
  }
  else {
    if (((env->active_fpu).fcr0 & 0x400000) == 0) goto LAB_0098caad;
LAB_0098ca90:
    uVar3 = env->hflags;
  }
  env->hflags = uVar3 | 0x80;
LAB_0098caad:
  if (((uVar2 >> 0x29 & 1) != 0) && ((env->CP0_Config5 & 0x8000000) != 0)) {
    pbVar1 = (byte *)((long)&env->hflags + 3);
    *pbVar1 = *pbVar1 | 1;
  }
  if ((((env->active_fpu).fcr0 & 0x20000000) != 0) && ((env->CP0_Config5 & 0x100) != 0)) {
    pbVar1 = (byte *)((long)&env->hflags + 3);
    *pbVar1 = *pbVar1 | 2;
  }
  if (((env->CP0_Config3 & 0x80) != 0) && ((env->CP0_PageGrain & 0x20000000) != 0)) {
    pbVar1 = (byte *)((long)&env->hflags + 3);
    *pbVar1 = *pbVar1 | 4;
  }
  return;
}

Assistant:

static inline void compute_hflags(CPUMIPSState *env)
{
    env->hflags &= ~(MIPS_HFLAG_COP1X | MIPS_HFLAG_64 | MIPS_HFLAG_CP0 |
                     MIPS_HFLAG_F64 | MIPS_HFLAG_FPU | MIPS_HFLAG_KSU |
                     MIPS_HFLAG_AWRAP | MIPS_HFLAG_DSP | MIPS_HFLAG_DSP_R2 |
                     MIPS_HFLAG_DSP_R3 | MIPS_HFLAG_SBRI | MIPS_HFLAG_MSA |
                     MIPS_HFLAG_FRE | MIPS_HFLAG_ELPA | MIPS_HFLAG_ERL);
    if (env->CP0_Status & (1 << CP0St_ERL)) {
        env->hflags |= MIPS_HFLAG_ERL;
    }
    if (!(env->CP0_Status & (1 << CP0St_EXL)) &&
        !(env->CP0_Status & (1 << CP0St_ERL)) &&
        !(env->hflags & MIPS_HFLAG_DM)) {
        env->hflags |= (env->CP0_Status >> CP0St_KSU) &
                       MIPS_HFLAG_KSU;
    }
#if defined(TARGET_MIPS64)
    if ((env->insn_flags & ISA_MIPS3) &&
        (((env->hflags & MIPS_HFLAG_KSU) != MIPS_HFLAG_UM) ||
         (env->CP0_Status & (1 << CP0St_PX)) ||
         (env->CP0_Status & (1 << CP0St_UX)))) {
        env->hflags |= MIPS_HFLAG_64;
    }

    if (!(env->insn_flags & ISA_MIPS3)) {
        env->hflags |= MIPS_HFLAG_AWRAP;
    } else if (((env->hflags & MIPS_HFLAG_KSU) == MIPS_HFLAG_UM) &&
               !(env->CP0_Status & (1 << CP0St_UX))) {
        env->hflags |= MIPS_HFLAG_AWRAP;
    } else if (env->insn_flags & ISA_MIPS64R6) {
        /* Address wrapping for Supervisor and Kernel is specified in R6 */
        if ((((env->hflags & MIPS_HFLAG_KSU) == MIPS_HFLAG_SM) &&
             !(env->CP0_Status & (1 << CP0St_SX))) ||
            (((env->hflags & MIPS_HFLAG_KSU) == MIPS_HFLAG_KM) &&
             !(env->CP0_Status & (1 << CP0St_KX)))) {
            env->hflags |= MIPS_HFLAG_AWRAP;
        }
    }
#endif
    if (((env->CP0_Status & (1 << CP0St_CU0)) &&
         !(env->insn_flags & ISA_MIPS32R6)) ||
        !(env->hflags & MIPS_HFLAG_KSU)) {
        env->hflags |= MIPS_HFLAG_CP0;
    }
    if (env->CP0_Status & (1 << CP0St_CU1)) {
        env->hflags |= MIPS_HFLAG_FPU;
    }
    if (env->CP0_Status & (1 << CP0St_FR)) {
        env->hflags |= MIPS_HFLAG_F64;
    }
    if (((env->hflags & MIPS_HFLAG_KSU) != MIPS_HFLAG_KM) &&
        (env->CP0_Config5 & (1 << CP0C5_SBRI))) {
        env->hflags |= MIPS_HFLAG_SBRI;
    }
    if (env->insn_flags & ASE_DSP_R3) {
        /*
         * Our cpu supports DSP R3 ASE, so enable
         * access to DSP R3 resources.
         */
        if (env->CP0_Status & (1 << CP0St_MX)) {
            env->hflags |= MIPS_HFLAG_DSP | MIPS_HFLAG_DSP_R2 |
                           MIPS_HFLAG_DSP_R3;
        }
    } else if (env->insn_flags & ASE_DSP_R2) {
        /*
         * Our cpu supports DSP R2 ASE, so enable
         * access to DSP R2 resources.
         */
        if (env->CP0_Status & (1 << CP0St_MX)) {
            env->hflags |= MIPS_HFLAG_DSP | MIPS_HFLAG_DSP_R2;
        }

    } else if (env->insn_flags & ASE_DSP) {
        /*
         * Our cpu supports DSP ASE, so enable
         * access to DSP resources.
         */
        if (env->CP0_Status & (1 << CP0St_MX)) {
            env->hflags |= MIPS_HFLAG_DSP;
        }

    }
    if (env->insn_flags & ISA_MIPS32R2) {
        if (env->active_fpu.fcr0 & (1 << FCR0_F64)) {
            env->hflags |= MIPS_HFLAG_COP1X;
        }
    } else if (env->insn_flags & ISA_MIPS32) {
        if (env->hflags & MIPS_HFLAG_64) {
            env->hflags |= MIPS_HFLAG_COP1X;
        }
    } else if (env->insn_flags & ISA_MIPS4) {
        /*
         * All supported MIPS IV CPUs use the XX (CU3) to enable
         * and disable the MIPS IV extensions to the MIPS III ISA.
         * Some other MIPS IV CPUs ignore the bit, so the check here
         * would be too restrictive for them.
         */
        if (env->CP0_Status & (1U << CP0St_CU3)) {
            env->hflags |= MIPS_HFLAG_COP1X;
        }
    }
    if (env->insn_flags & ASE_MSA) {
        if (env->CP0_Config5 & (1 << CP0C5_MSAEn)) {
            env->hflags |= MIPS_HFLAG_MSA;
        }
    }
    if (env->active_fpu.fcr0 & (1 << FCR0_FREP)) {
        if (env->CP0_Config5 & (1 << CP0C5_FRE)) {
            env->hflags |= MIPS_HFLAG_FRE;
        }
    }
    if (env->CP0_Config3 & (1 << CP0C3_LPA)) {
        if (env->CP0_PageGrain & (1 << CP0PG_ELPA)) {
            env->hflags |= MIPS_HFLAG_ELPA;
        }
    }
}